

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
VectorInstance::op_popFront
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  __shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 *puVar2;
  shared_ptr<Instance> instance;
  
  if ((arguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (arguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    p_Var1 = &((this->_value).
               super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>;
    if (&((this->_value).
          super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->
         super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> == p_Var1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"null",(allocator *)&instance);
    }
    else {
      std::__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>,p_Var1);
      std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::erase
                (&this->_value,
                 (this->_value).
                 super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      (*(instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Instance
        [2])(__return_storage_ptr__);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    return __return_storage_ptr__;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "RuntimeError: wrong number of arguments.";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

std::string StringInstance::op_last(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int n = IntegerInstance(arguments[0]).value();
    if (n < 0)
        throw EXC_INVALID_ARGUMENT;
    n = std::min(n, int(_value.size()));
    return "\"" + str_utils::escape(_value.substr(int(_value.size()) - n), '"') + "\"";
}